

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

long __thiscall
duckdb::Interpolator<false>::Operation<long,long,duckdb::QuantileDirect<long>>
          (Interpolator<false> *this,long *v_t,Vector *result,QuantileDirect<long> *accessor)

{
  bool bVar1;
  QuantileCompare<duckdb::QuantileDirect<long>_> __comp;
  QuantileCompare<duckdb::QuantileDirect<long>_> __comp_00;
  QuantileCompare<duckdb::QuantileDirect<long>_> __comp_01;
  long lVar2;
  long lVar3;
  undefined7 uStack_57;
  undefined7 uStack_3f;
  undefined7 uStack_27;
  
  bVar1 = this->desc;
  if (this->CRN == this->FRN) {
    __comp._17_7_ = uStack_27;
    __comp.desc = bVar1;
    __comp.accessor_r = accessor;
    __comp.accessor_l = accessor;
    ::std::nth_element<long*,duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>
              (v_t + this->begin,v_t + this->CRN,v_t + this->end,__comp);
    lVar2 = Cast::Operation<long,long>(v_t[this->FRN]);
    return lVar2;
  }
  __comp_00._17_7_ = uStack_3f;
  __comp_00.desc = bVar1;
  __comp_00.accessor_r = accessor;
  __comp_00.accessor_l = accessor;
  ::std::nth_element<long*,duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp_00);
  __comp_01._17_7_ = uStack_57;
  __comp_01.desc = bVar1;
  __comp_01.accessor_r = accessor;
  __comp_01.accessor_l = accessor;
  ::std::nth_element<long*,duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>
            (v_t + this->FRN,v_t + this->CRN,v_t + this->end,__comp_01);
  lVar2 = Cast::Operation<long,long>(v_t[this->FRN]);
  lVar3 = Cast::Operation<long,long>(v_t[this->CRN]);
  return (long)((double)(lVar3 - lVar2) *
                (this->RN -
                (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) + (double)lVar2
               );
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}